

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardStringIterator.h
# Opt level: O0

ssize_t __thiscall
bwtil::BackwardStringIterator::read
          (BackwardStringIterator *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  undefined1 local_1;
  
  if (this->position == 0) {
    local_1 = 0;
  }
  else {
    this->position = this->position - 1;
    puVar1 = (undefined1 *)std::__cxx11::string::at((ulong)&this->in_str);
    local_1 = *puVar1;
    this = (BackwardStringIterator *)CONCAT71((int7)((ulong)puVar1 >> 8),local_1);
  }
  return CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

symbol read(){

		if(position>0){

			position--;
			return in_str.at(position);

		}

		return 0;

	}